

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_opt0
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 ZSTD_dictMode_e dictMode)

{
  ZSTD_optimal_t *pZVar1;
  undefined8 *puVar2;
  ZSTD_OptPrice_e ZVar3;
  BYTE *pBVar4;
  ZSTD_optimal_t *pZVar5;
  rawSeqStore_t *prVar6;
  undefined8 uVar7;
  seqDef *psVar8;
  int iVar9;
  U32 UVar10;
  optState_t *optPtr;
  U32 i;
  U32 UVar11;
  U32 UVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  uint *puVar16;
  ZSTD_optimal_t *pZVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  BYTE *pBVar23;
  uint uVar24;
  uint uVar25;
  ZSTD_optimal_t *pZVar26;
  ulong uVar27;
  ZSTD_optimal_t *pZVar28;
  ZSTD_match_t *matches;
  int iVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  U32 UVar34;
  bool bVar35;
  U32 nbMatches;
  uint uStack_14c;
  uint local_148 [2];
  ZSTD_optimal_t *local_140;
  ZSTD_matchState_t *local_138;
  ZSTD_optimal_t *local_130;
  ZSTD_optimal_t *local_128;
  ZSTD_optimal_t *local_120;
  ZSTD_match_t *local_118;
  uint local_10c;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  U32 *local_f0;
  ZSTD_optimal_t *local_e8;
  ZSTD_optimal_t *local_e0;
  BYTE *local_d8;
  optState_t *local_d0;
  int local_c8;
  U32 nextToUpdate3;
  ZSTD_optimal_t *local_c0;
  ulong local_b8;
  undefined8 local_b0;
  U32 local_a8;
  void *local_a0;
  ZSTD_getAllMatchesFn local_98;
  seqStore_t *local_90;
  ZSTD_optimal_t *local_88;
  ulong local_80;
  ZSTD_optimal_t *local_78;
  BYTE *local_70;
  ZSTD_optLdm_t local_68;
  
  local_d0 = &ms->opt;
  local_c0 = (ZSTD_optimal_t *)((long)src + (srcSize - 8));
  uVar32 = (ms->window).dictLimit;
  pBVar4 = (ms->window).base;
  local_f0 = rep;
  local_90 = seqStore;
  local_98 = ZSTD_selectBtGetAllMatches(ms,dictMode);
  uVar14 = (ms->cParams).targetLength;
  local_10c = 0xfff;
  if (uVar14 < 0xfff) {
    local_10c = uVar14;
  }
  local_140 = (ZSTD_optimal_t *)CONCAT71(local_140._1_7_,(ms->cParams).minMatch != 3);
  nextToUpdate3 = ms->nextToUpdate;
  local_118 = (ms->opt).matchTable;
  pZVar5 = (ms->opt).priceTable;
  local_b0 = 0;
  local_a8 = 0;
  prVar6 = ms->ldmSeqStore;
  if (prVar6 == (rawSeqStore_t *)0x0) {
    local_68.seqStore.posInSequence = 0;
    local_68.seqStore.size = 0;
    local_68.seqStore.seq = (rawSeq *)0x0;
    local_68.seqStore.pos = 0;
    local_68.seqStore.capacity = 0;
  }
  else {
    local_68.seqStore.capacity = prVar6->capacity;
    local_68.seqStore.seq = prVar6->seq;
    local_68.seqStore.pos = prVar6->pos;
    local_68.seqStore.posInSequence = prVar6->posInSequence;
    local_68.seqStore.size = prVar6->size;
  }
  pBVar23 = (BYTE *)((long)src + srcSize);
  local_68.offset = 0;
  local_68.startPosInBlock = 0;
  local_68.endPosInBlock = 0;
  ZSTD_opt_getNextMatchAndUpdateSeqStore(&local_68,0,(U32)srcSize);
  ZSTD_rescaleFreqs(local_d0,(BYTE *)src,srcSize,0);
  pZVar26 = (ZSTD_optimal_t *)((ulong)(pBVar4 + uVar32 == (BYTE *)src) + (long)src);
  if (pZVar26 < local_c0) {
    local_b8 = (ulong)((byte)local_140 + 3);
    local_70 = pBVar23 + -0x20;
    local_80 = (ulong)((byte)local_140 + 3);
    local_140 = pZVar5 + 1;
    local_c8 = 0;
    local_100 = 0;
    local_f8 = 0;
    local_108 = 0;
    matches = local_118;
    local_138 = ms;
    local_d8 = pBVar23;
    local_a0 = src;
    local_88 = local_140;
    do {
      iVar19 = (int)pZVar26;
      uVar32 = iVar19 - (int)src;
      local_130 = (ZSTD_optimal_t *)src;
      nbMatches = (*local_98)(matches,ms,&nextToUpdate3,(BYTE *)pZVar26,pBVar23,local_f0,
                              SUB14(uVar32 == 0,0),(U32)local_b8);
      ZSTD_optLdm_processMatchCandidate
                (&local_68,matches,&nbMatches,iVar19 - (int)local_a0,(int)pBVar23 - iVar19);
      UVar34 = nbMatches;
      if (nbMatches == 0) {
        local_e0 = (ZSTD_optimal_t *)((long)&pZVar26->price + 1);
        uVar22 = 0;
        iVar19 = 2;
        pZVar26 = local_140;
      }
      else {
        lVar15 = 0;
        do {
          pZVar5->rep[lVar15] = local_f0[lVar15];
          lVar15 = lVar15 + 1;
        } while (lVar15 != 3);
        pZVar5->mlen = 0;
        pZVar5->litlen = uVar32;
        local_e0 = pZVar26;
        UVar11 = ZSTD_litLengthPrice(uVar32,local_d0,0);
        pZVar5->price = UVar11;
        uVar14 = local_118[UVar34 - 1].len;
        if (local_10c < uVar14) {
          local_100 = (ulong)local_118[UVar34 - 1].off;
          uVar22 = (ulong)(uVar14 + uVar32);
          iVar19 = 7;
          local_108 = (ulong)uVar14;
          local_f8 = (ulong)uVar32;
          pZVar26 = (ZSTD_optimal_t *)0x0;
        }
        else {
          if ((int)UVar11 < 0) {
            __assert_fail("opt[0].price >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x839b,
                          "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                         );
          }
          ZVar3 = (local_138->opt).priceType;
          iVar19 = 0;
          if (ZVar3 != zop_predef) {
            uVar24 = *(local_138->opt).litLengthFreq + 1;
            uVar14 = 0x1f;
            if (uVar24 != 0) {
              for (; uVar24 >> uVar14 == 0; uVar14 = uVar14 - 1) {
              }
            }
            iVar19 = (local_138->opt).litLengthSumBasePrice + (uVar14 ^ 0x1f) * 0x100 + -0x1f00;
          }
          uVar22 = 1;
          pZVar26 = local_88;
          do {
            pZVar26->price = 0x40000000;
            uVar22 = uVar22 + 1;
            pZVar26 = pZVar26 + 1;
          } while (local_80 != uVar22);
          local_120 = (ZSTD_optimal_t *)(ulong)(UVar34 + (UVar34 == 0));
          pZVar26 = (ZSTD_optimal_t *)0x0;
          do {
            uVar14 = local_118[(long)pZVar26].len;
            local_128 = pZVar26;
            if ((uint)uVar22 <= uVar14) {
              uVar24 = local_118[(long)pZVar26].off;
              uVar25 = 0x1f;
              if (uVar24 != 0) {
                for (; uVar24 >> uVar25 == 0; uVar25 = uVar25 - 1) {
                }
              }
              iVar9 = uVar25 * 0x200 + -0x25cd;
              if (uVar25 < 0x14) {
                iVar9 = 0x33;
              }
              do {
                uVar21 = (uint)uVar22;
                if (uVar21 < 3) {
LAB_001770c9:
                  __assert_fail("matchLength >= MINMATCH",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0x806c,
                                "U32 ZSTD_getMatchPrice(const U32, const U32, const optState_t *const, const int)"
                               );
                }
                if (ZVar3 == zop_predef) {
                  iVar29 = 0x1f;
                  if (uVar21 - 2 != 0) {
                    for (; uVar21 - 2 >> iVar29 == 0; iVar29 = iVar29 + -1) {
                    }
                  }
                  iVar29 = iVar29 * 0x100 + uVar25 * 0x100 + 0x1000;
                }
                else {
                  uVar13 = uVar21 - 3;
                  if (uVar13 < 0x80) {
                    uVar13 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar13];
                  }
                  else {
                    uVar31 = 0x1f;
                    if (uVar13 != 0) {
                      for (; uVar13 >> uVar31 == 0; uVar31 = uVar31 - 1) {
                      }
                    }
                    uVar13 = (uVar31 ^ 0xffffffe0) + 0x44;
                  }
                  uVar33 = (local_138->opt).offCodeFreq[uVar25] + 1;
                  uVar31 = 0x1f;
                  if (uVar33 != 0) {
                    for (; uVar33 >> uVar31 == 0; uVar31 = uVar31 - 1) {
                    }
                  }
                  uVar30 = (local_138->opt).matchLengthFreq[uVar13] + 1;
                  uVar33 = 0x1f;
                  if (uVar30 != 0) {
                    for (; uVar30 >> uVar33 == 0; uVar33 = uVar33 - 1) {
                    }
                  }
                  iVar29 = (uVar33 ^ 0x1f) * 0x100 +
                           (local_138->opt).offCodeSumBasePrice + iVar9 + (uVar31 ^ 0x1f) * 0x100 +
                           (local_138->opt).matchLengthSumBasePrice + (""[uVar13] + uVar25) * 0x100
                           + -0x3e00;
                }
                uVar22 = uVar22 & 0xffffffff;
                pZVar5[uVar22].mlen = uVar21;
                pZVar5[uVar22].off = uVar24;
                pZVar5[uVar22].litlen = uVar32;
                pZVar5[uVar22].price = iVar29 + iVar19 + UVar11;
                uVar22 = (ulong)(uVar21 + 1);
              } while (uVar21 + 1 <= uVar14);
            }
            pZVar26 = (ZSTD_optimal_t *)((long)&pZVar26->price + 1);
          } while (pZVar26 != local_120);
          uVar22 = (ulong)((int)uVar22 - 1);
          iVar19 = 0;
          pZVar26 = local_140;
        }
      }
      uVar27 = local_100;
      uVar18 = local_108;
      if (iVar19 == 7) {
LAB_00176cd1:
        if (pZVar5->mlen != 0) {
          __assert_fail("opt[0].mlen == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x842b,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        uVar22 = (ulong)pZVar26 & 0xffffffff;
        uVar32 = (uint)uVar27;
        if ((U32)uVar18 == 0) {
          local_f0[2] = pZVar5[uVar22].rep[2];
          *(undefined8 *)local_f0 = *(undefined8 *)pZVar5[uVar22].rep;
        }
        else {
          local_148[0] = pZVar5[uVar22].rep[2];
          uVar7 = *(undefined8 *)pZVar5[uVar22].rep;
          nbMatches = (U32)uVar7;
          uStack_14c = (uint)((ulong)uVar7 >> 0x20);
          if (uVar32 < 4) {
            if (uVar32 == 0) {
LAB_0017725c:
              __assert_fail("OFFBASE_IS_REPCODE(offBase)",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x46c3,"void ZSTD_updateRep(U32 *, const U32, const U32)");
            }
            uVar24 = (((U32)local_f8 == 0) + uVar32) - 1;
            UVar34 = nbMatches;
            uVar14 = uStack_14c;
            if (uVar24 != 0) {
              if (uVar24 == 3) {
                UVar34 = nbMatches - 1;
              }
              else {
                UVar34 = (&nbMatches)[uVar24];
              }
              puVar16 = &uStack_14c;
              if (uVar24 == 1) {
                puVar16 = local_148;
              }
              local_148[0] = *puVar16;
              uStack_14c = nbMatches;
              uVar14 = uStack_14c;
            }
          }
          else {
            UVar34 = uVar32 - 3;
            uVar14 = nbMatches;
            local_148[0] = uStack_14c;
          }
          uStack_14c = uVar14;
          nbMatches = UVar34;
          *(ulong *)local_f0 = CONCAT44(uStack_14c,nbMatches);
          local_f0[2] = local_148[0];
        }
        iVar19 = (int)pZVar26;
        uVar14 = iVar19 + 1;
        if (0xfff < uVar14) {
          __assert_fail("storeEnd < ZSTD_OPT_NUM",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x843e,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        local_e8 = (ZSTD_optimal_t *)(ulong)uVar14;
        pZVar5[(long)local_e8].price = local_c8;
        pZVar5[(long)local_e8].off = uVar32;
        pZVar5[(long)local_e8].mlen = (U32)uVar18;
        pZVar5[(long)local_e8].litlen = (U32)local_f8;
        *(undefined8 *)pZVar5[(long)local_e8].rep = local_b0;
        pZVar5[(long)local_e8].rep[2] = local_a8;
        uVar22 = (ulong)pZVar26 & 0xffffffff;
        uVar20 = (ulong)pZVar26 & 0xffffffff;
        uVar32 = uVar14;
        if (iVar19 != 0) {
          do {
            uVar24 = (uint)uVar20;
            uVar25 = pZVar5[uVar20].litlen + pZVar5[uVar20].mlen;
            uVar32 = (uint)uVar22;
            pZVar17 = pZVar5 + uVar20;
            iVar9 = pZVar17->price;
            UVar11 = pZVar17->off;
            UVar12 = pZVar17->mlen;
            UVar10 = pZVar17->litlen;
            pZVar17 = pZVar5 + uVar20;
            UVar34 = pZVar17->rep[0];
            uVar7 = *(undefined8 *)(&pZVar17->litlen + 2);
            pZVar28 = pZVar5 + uVar22;
            pZVar28->litlen = pZVar17->litlen;
            pZVar28->rep[0] = UVar34;
            *(undefined8 *)(&pZVar28->litlen + 2) = uVar7;
            pZVar17 = pZVar5 + uVar22;
            pZVar17->price = iVar9;
            pZVar17->off = UVar11;
            pZVar17->mlen = UVar12;
            pZVar17->litlen = UVar10;
            uVar22 = (ulong)(uVar32 - 1);
            uVar20 = (ulong)(uVar24 - uVar25);
            if (uVar25 > uVar24) {
              uVar20 = 0;
            }
          } while (uVar25 <= uVar24 && uVar24 - uVar25 != 0);
        }
        pZVar17 = local_130;
        pBVar23 = local_d8;
        pZVar28 = local_e0;
        local_140 = pZVar26;
        local_108 = uVar18;
        local_100 = uVar27;
        if (uVar32 <= uVar14) {
          pZVar26 = (ZSTD_optimal_t *)(ulong)uVar32;
          local_120 = (ZSTD_optimal_t *)(ulong)(iVar19 + 2);
          do {
            uVar32 = pZVar5[(long)pZVar26].litlen;
            uVar22 = (ulong)uVar32;
            uVar14 = pZVar5[(long)pZVar26].mlen;
            if ((ulong)uVar14 == 0) {
              if (pZVar26 != local_e8) {
                __assert_fail("storePos == storeEnd",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x8457,
                              "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                             );
              }
              pZVar28 = (ZSTD_optimal_t *)((long)pZVar17->rep + (uVar22 - 0x10));
            }
            else {
              pBVar4 = (BYTE *)((long)pZVar17->rep + (uVar22 - 0x10));
              if (pBVar23 < pBVar4) {
                __assert_fail("anchor + llen <= iend",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x845c,
                              "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                             );
              }
              local_128 = (ZSTD_optimal_t *)CONCAT44(local_128._4_4_,pZVar5[(long)pZVar26].off);
              ZSTD_updateStats(local_d0,uVar32,(BYTE *)pZVar17,pZVar5[(long)pZVar26].off,uVar14);
              if (local_90->maxNbSeq <=
                  (ulong)((long)local_90->sequences - (long)local_90->sequencesStart >> 3)) {
                __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x468b,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              if (0x20000 < local_90->maxNbLit) {
                __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x468d,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              pBVar23 = local_90->lit;
              if (local_90->litStart + local_90->maxNbLit < pBVar23 + uVar22) {
                __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x468e,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              if (local_70 < pBVar4) {
                ZSTD_safecopyLiterals(pBVar23,(BYTE *)pZVar17,pBVar4,local_70);
              }
              else {
                uVar7 = *(undefined8 *)&pZVar17->mlen;
                *(undefined8 *)pBVar23 = *(undefined8 *)pZVar17;
                *(undefined8 *)(pBVar23 + 8) = uVar7;
                if (0x10 < uVar32) {
                  pBVar4 = local_90->lit;
                  if ((BYTE *)0xffffffffffffffe0 < pBVar4 + 0x10 + (-0x10 - (long)pZVar17->rep)) {
                    __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0x36a6,
                                  "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                                 );
                  }
                  uVar7 = *(undefined8 *)(pZVar17->rep + 2);
                  *(undefined8 *)(pBVar4 + 0x10) = *(undefined8 *)pZVar17->rep;
                  *(undefined8 *)(pBVar4 + 0x18) = uVar7;
                  if (0x20 < uVar32) {
                    lVar15 = 0;
                    do {
                      puVar2 = (undefined8 *)((long)pZVar17[1].rep + lVar15 + -0xc);
                      uVar7 = puVar2[1];
                      pBVar23 = pBVar4 + lVar15 + 0x20;
                      *(undefined8 *)pBVar23 = *puVar2;
                      *(undefined8 *)(pBVar23 + 8) = uVar7;
                      puVar2 = (undefined8 *)((long)pZVar17[1].rep + lVar15 + 4);
                      uVar7 = puVar2[1];
                      *(undefined8 *)(pBVar23 + 0x10) = *puVar2;
                      *(undefined8 *)(pBVar23 + 0x18) = uVar7;
                      lVar15 = lVar15 + 0x20;
                    } while (pBVar23 + 0x20 < pBVar4 + uVar22);
                  }
                }
              }
              local_90->lit = local_90->lit + uVar22;
              if (0xffff < uVar32) {
                if (local_90->longLengthType != ZSTD_llt_none) {
                  __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0x46a0,
                                "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                               );
                }
                local_90->longLengthType = ZSTD_llt_literalLength;
                local_90->longLengthPos =
                     (U32)((ulong)((long)local_90->sequences - (long)local_90->sequencesStart) >> 3)
                ;
              }
              psVar8 = local_90->sequences;
              psVar8->litLength = (U16)uVar32;
              psVar8->offBase = (U32)local_128;
              if (uVar14 < 3) {
                __assert_fail("matchLength >= MINMATCH",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x46aa,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              uVar22 = (ulong)uVar14 - 3;
              if (0xffff < uVar22) {
                if (local_90->longLengthType != ZSTD_llt_none) {
                  __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0x46ad,
                                "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                               );
                }
                local_90->longLengthType = ZSTD_llt_matchLength;
                local_90->longLengthPos =
                     (U32)((ulong)((long)psVar8 - (long)local_90->sequencesStart) >> 3);
              }
              psVar8->mlBase = (U16)uVar22;
              local_90->sequences = psVar8 + 1;
              pZVar17 = (ZSTD_optimal_t *)((long)pZVar17->rep + ((ulong)(uVar14 + uVar32) - 0x10));
              pBVar23 = local_d8;
              pZVar28 = pZVar17;
            }
            pZVar26 = (ZSTD_optimal_t *)((long)&pZVar26->price + 1);
          } while (pZVar26 != local_120);
        }
        ms = local_138;
        local_e0 = pZVar28;
        ZSTD_setBasePrices(local_d0,0);
        matches = local_118;
        local_130 = pZVar17;
        pZVar26 = local_140;
      }
      else {
        pBVar23 = local_d8;
        matches = local_118;
        ms = local_138;
        if (iVar19 == 0) {
          if ((int)uVar22 != 0) {
            pZVar26 = (ZSTD_optimal_t *)0x1;
            do {
              optPtr = local_d0;
              if (0xfff < (uint)pZVar26) {
                __assert_fail("cur < ZSTD_OPT_NUM",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x83b6,
                              "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                             );
              }
              uVar32 = (uint)pZVar26 - 1;
              local_e8 = pZVar5 + uVar32;
              UVar34 = 1;
              if (pZVar5[uVar32].mlen == 0) {
                UVar34 = local_e8->litlen + 1;
              }
              local_120 = (ZSTD_optimal_t *)((long)pZVar26->rep + (long)(local_e0->rep + -8));
              local_128 = (ZSTD_optimal_t *)CONCAT44(local_128._4_4_,local_e8->price);
              local_140 = pZVar26;
              UVar11 = ZSTD_rawLiteralsCost
                                 ((BYTE *)((long)local_120[-1].rep + 0xb),(U32)local_d0,
                                  (optState_t *)0x0,local_e8->price);
              UVar12 = ZSTD_litLengthPrice(UVar34,optPtr,0);
              iVar19 = UVar12 + UVar11 + (U32)local_128;
              UVar11 = ZSTD_litLengthPrice(UVar34 - 1,optPtr,0);
              pBVar4 = local_d8;
              matches = local_118;
              pZVar28 = local_120;
              pZVar17 = local_128;
              iVar19 = iVar19 - UVar11;
              if (999999999 < iVar19) {
                __assert_fail("price < 1000000000",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x83bf,
                              "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                             );
              }
              pZVar1 = pZVar5 + (long)pZVar26;
              if (iVar19 <= pZVar5[(long)pZVar26].price) {
                pZVar1->off = 0;
                pZVar1->mlen = 0;
                pZVar1->litlen = UVar34;
                pZVar1->price = iVar19;
              }
              uVar32 = pZVar1->mlen;
              uVar14 = (uint)local_140;
              if (uVar14 < uVar32) {
                __assert_fail("cur >= opt[cur].mlen",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x83d5,
                              "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                             );
              }
              if (uVar32 == 0) {
                pZVar1->rep[2] = local_e8->rep[2];
                *(undefined8 *)pZVar1->rep = *(undefined8 *)local_e8->rep;
              }
              else {
                uVar24 = pZVar1->off;
                local_148[0] = pZVar5[uVar14 - uVar32].rep[2];
                nbMatches = (U32)*(undefined8 *)pZVar5[uVar14 - uVar32].rep;
                uStack_14c = (uint)((ulong)*(undefined8 *)pZVar5[uVar14 - uVar32].rep >> 0x20);
                if (uVar24 < 4) {
                  if (uVar24 == 0) goto LAB_0017725c;
                  uVar24 = (uVar24 + (pZVar1->litlen == 0)) - 1;
                  UVar34 = nbMatches;
                  uVar32 = uStack_14c;
                  if (uVar24 != 0) {
                    if (uVar24 == 3) {
                      UVar34 = nbMatches - 1;
                    }
                    else {
                      UVar34 = (&nbMatches)[uVar24];
                    }
                    puVar16 = &uStack_14c;
                    if (uVar24 == 1) {
                      puVar16 = local_148;
                    }
                    local_148[0] = *puVar16;
                    uStack_14c = nbMatches;
                    uVar32 = uStack_14c;
                  }
                }
                else {
                  UVar34 = uVar24 - 3;
                  uVar32 = nbMatches;
                  local_148[0] = uStack_14c;
                }
                uStack_14c = uVar32;
                nbMatches = UVar34;
                *(ulong *)pZVar1->rep = CONCAT44(uStack_14c,nbMatches);
                pZVar1->rep[2] = local_148[0];
              }
              uVar32 = 0x13;
              if (local_120 <= local_c0) {
                if (uVar14 == (uint)uVar22) {
                  uVar32 = 0x11;
                }
                else {
                  uVar14 = pZVar1->price;
                  if ((int)(uVar14 + 0x80) < pZVar1[1].price) {
                    local_e8 = (ZSTD_optimal_t *)(ulong)uVar14;
                    if ((int)uVar14 < 0) {
                      __assert_fail("opt[cur].price >= 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0x83e9,
                                    "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                                   );
                    }
                    iVar19 = 0;
                    bVar35 = pZVar1->mlen != 0;
                    local_128 = (ZSTD_optimal_t *)((ulong)local_128 & 0xffffffff00000000);
                    if (!bVar35) {
                      local_128._4_4_ = SUB84(pZVar17,4);
                      local_128 = (ZSTD_optimal_t *)CONCAT44(local_128._4_4_,pZVar1->litlen);
                    }
                    if ((local_138->opt).priceType != zop_predef) {
                      uVar14 = *(local_138->opt).litLengthFreq + 1;
                      uVar32 = 0x1f;
                      if (uVar14 != 0) {
                        for (; uVar14 >> uVar32 == 0; uVar32 = uVar32 - 1) {
                        }
                      }
                      iVar19 = (local_138->opt).litLengthSumBasePrice + (uVar32 ^ 0x1f) * 0x100 +
                               -0x1f00;
                    }
                    local_78 = pZVar1;
                    nbMatches = (*local_98)(local_118,local_138,&nextToUpdate3,(BYTE *)local_120,
                                            local_d8,pZVar1->rep,SUB14(bVar35,0),(U32)local_b8);
                    ZSTD_optLdm_processMatchCandidate
                              (&local_68,matches,&nbMatches,(int)pZVar28 - (int)local_a0,
                               (int)pBVar4 - (int)pZVar28);
                    if (nbMatches == 0) {
                      uVar32 = 0x13;
                    }
                    else {
                      uVar14 = matches[nbMatches - 1].len;
                      bVar35 = 0xfff < (int)local_140 + uVar14;
                      uVar32 = 0;
                      if (bVar35 || local_10c < uVar14) {
                        UVar34 = 0;
                        if (local_78->mlen == 0) {
                          UVar34 = local_78->litlen;
                        }
                        uVar32 = (int)local_140 - UVar34;
                        uVar22 = (ulong)(uVar14 + (U32)local_128 + uVar32);
                        if (0x1000 < uVar32) {
                          uVar32 = 0;
                        }
                        local_140 = (ZSTD_optimal_t *)(ulong)uVar32;
                        local_100 = (ulong)matches[nbMatches - 1].off;
                        uVar32 = 7;
                        local_108 = (ulong)uVar14;
                        local_f8 = (ulong)local_128 & 0xffffffff;
                      }
                      if (!bVar35 && local_10c >= uVar14) {
                        local_120 = (ZSTD_optimal_t *)(ulong)(nbMatches + (nbMatches == 0));
                        pZVar26 = (ZSTD_optimal_t *)0x0;
                        do {
                          uVar32 = (uint)local_b8;
                          if (pZVar26 != (ZSTD_optimal_t *)0x0) {
                            uVar32 = matches[(long)((long)pZVar26[-1].rep + 0xb)].len + 1;
                          }
                          uVar27 = (ulong)matches[(long)pZVar26].len;
                          if (uVar32 <= matches[(long)pZVar26].len) {
                            uVar14 = matches[(long)pZVar26].off;
                            uVar24 = 0x1f;
                            if (uVar14 != 0) {
                              for (; uVar14 >> uVar24 == 0; uVar24 = uVar24 - 1) {
                              }
                            }
                            iVar9 = uVar24 * 0x200 + -0x25cd;
                            if (uVar24 < 0x14) {
                              iVar9 = 0x33;
                            }
                            do {
                              if (uVar27 < 3) goto LAB_001770c9;
                              UVar34 = (U32)uVar27;
                              if ((local_138->opt).priceType == zop_predef) {
                                iVar29 = 0x1f;
                                if (UVar34 - 2 != 0) {
                                  for (; UVar34 - 2 >> iVar29 == 0; iVar29 = iVar29 + -1) {
                                  }
                                }
                                iVar29 = iVar29 * 0x100 + uVar24 * 0x100 + 0x1000;
                              }
                              else {
                                uVar25 = UVar34 - 3;
                                if (uVar25 < 0x80) {
                                  uVar25 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar25];
                                }
                                else {
                                  uVar21 = 0x1f;
                                  if (uVar25 != 0) {
                                    for (; uVar25 >> uVar21 == 0; uVar21 = uVar21 - 1) {
                                    }
                                  }
                                  uVar25 = (uVar21 ^ 0xffffffe0) + 0x44;
                                }
                                uVar13 = (local_138->opt).offCodeFreq[uVar24] + 1;
                                uVar21 = 0x1f;
                                if (uVar13 != 0) {
                                  for (; uVar13 >> uVar21 == 0; uVar21 = uVar21 - 1) {
                                  }
                                }
                                uVar31 = (local_138->opt).matchLengthFreq[uVar25] + 1;
                                uVar13 = 0x1f;
                                if (uVar31 != 0) {
                                  for (; uVar31 >> uVar13 == 0; uVar13 = uVar13 - 1) {
                                  }
                                }
                                iVar29 = (uVar13 ^ 0x1f) * 0x100 +
                                         (local_138->opt).offCodeSumBasePrice + iVar9 +
                                         (uVar21 ^ 0x1f) * 0x100 +
                                         (local_138->opt).matchLengthSumBasePrice +
                                         (""[uVar25] + uVar24) * 0x100 + -0x3e00;
                              }
                              iVar29 = iVar29 + iVar19 + (int)local_e8;
                              uVar25 = (int)local_140 + UVar34;
                              uVar18 = (ulong)uVar25;
                              if (((uint)uVar22 < uVar25) ||
                                 (bVar35 = true, iVar29 < pZVar5[uVar18].price)) {
                                if ((uint)uVar22 < uVar25) {
                                  uVar22 = uVar22 & 0xffffffff;
                                  pZVar17 = local_88 + uVar22;
                                  do {
                                    uVar22 = uVar22 + 1;
                                    pZVar17->price = 0x40000000;
                                    pZVar17 = pZVar17 + 1;
                                  } while (uVar22 < uVar18);
                                }
                                pZVar5[uVar18].mlen = UVar34;
                                pZVar5[uVar18].off = uVar14;
                                pZVar5[uVar18].litlen = (U32)local_128;
                                pZVar5[uVar18].price = iVar29;
                                bVar35 = false;
                              }
                            } while ((!bVar35) && (uVar27 = uVar27 - 1, uVar32 <= (uint)uVar27));
                          }
                          pZVar26 = (ZSTD_optimal_t *)((long)&pZVar26->price + 1);
                          matches = local_118;
                        } while (pZVar26 != local_120);
                        uVar32 = 0;
                      }
                    }
                  }
                }
              }
              ms = local_138;
              pBVar23 = local_d8;
              pZVar26 = local_140;
              if (uVar32 < 0x11) {
                if (uVar32 != 0) {
                  uVar27 = local_100;
                  uVar18 = local_108;
                  if (uVar32 == 7) goto LAB_00176cd1;
                  goto LAB_00177099;
                }
              }
              else if (uVar32 != 0x13) {
                if (uVar32 != 0x11) goto LAB_00177099;
                break;
              }
              uVar32 = (int)local_140 + 1;
              pZVar26 = (ZSTD_optimal_t *)(ulong)uVar32;
            } while (uVar32 <= (uint)uVar22);
          }
          uVar18 = uVar22 & 0xffffffff;
          local_c8 = pZVar5[uVar18].price;
          local_a8 = pZVar5[uVar18].rep[2];
          local_b0 = *(undefined8 *)pZVar5[uVar18].rep;
          local_f8 = (ulong)pZVar5[uVar18].litlen;
          uVar32 = pZVar5[uVar18].litlen + pZVar5[uVar18].mlen;
          uVar14 = (uint)uVar22 - uVar32;
          if ((uint)uVar22 < uVar32) {
            uVar14 = 0;
          }
          pZVar26 = (ZSTD_optimal_t *)(ulong)uVar14;
          uVar27 = (ulong)pZVar5[uVar18].off;
          uVar18 = (ulong)pZVar5[uVar18].mlen;
          if (0xfff < uVar14) {
            __assert_fail("cur < ZSTD_OPT_NUM",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x8428,
                          "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                         );
          }
          goto LAB_00176cd1;
        }
      }
LAB_00177099:
      local_140 = pZVar26;
      src = local_130;
      pZVar26 = local_e0;
    } while (local_e0 < local_c0);
  }
  return (long)pBVar23 - (long)src;
}

Assistant:

static size_t ZSTD_compressBlock_opt0(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        const void* src, size_t srcSize, const ZSTD_dictMode_e dictMode)
{
    return ZSTD_compressBlock_opt_generic(ms, seqStore, rep, src, srcSize, 0 /* optLevel */, dictMode);
}